

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  char *pcVar5;
  ulong uVar6;
  char *__lhs;
  bool bVar7;
  char *local_508;
  bool local_4e5;
  char *local_4d0;
  char *local_4c8;
  char *local_3f0;
  char *local_3c0;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  char *local_328;
  char *soversion;
  string local_300;
  string local_2e0;
  string local_2c0 [8];
  string fw_prefix;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string langPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string langSuff;
  string ll;
  char *suffixVar;
  char *prefixVar;
  string configProp;
  char *configPostfix;
  string local_120;
  byte local_fb;
  byte local_fa;
  allocator<char> local_f9;
  string local_f8;
  char *local_d8;
  char *targetSuffix;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  char *local_80;
  char *targetPrefix;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_39;
  string *psStack_38;
  bool isImportedLibraryArtifact;
  string *outSuffix_local;
  string *outBase_local;
  string *outPrefix_local;
  string *psStack_18;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  psStack_38 = outSuffix;
  outSuffix_local = outBase;
  outBase_local = outPrefix;
  outPrefix_local._4_4_ = artifact;
  psStack_18 = config;
  config_local = (string *)this;
  TVar3 = GetType(this);
  if ((((TVar3 == STATIC_LIBRARY) || (TVar3 = GetType(this), TVar3 == SHARED_LIBRARY)) ||
      (TVar3 = GetType(this), TVar3 == MODULE_LIBRARY)) ||
     (TVar3 = GetType(this), TVar3 == EXECUTABLE)) {
    local_39 = outPrefix_local._4_4_ == ImportLibraryArtifact;
    local_62 = 0;
    targetPrefix._3_1_ = 0;
    bVar7 = false;
    if ((bool)local_39) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_62 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_61);
      targetPrefix._3_1_ = 1;
      pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_60);
      bVar7 = pcVar5 == (char *)0x0;
    }
    if ((targetPrefix._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((local_62 & 1) != 0) {
      std::allocator<char>::~allocator(&local_61);
    }
    if (bVar7) {
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
    }
    else {
      TVar3 = GetType(this);
      if (((TVar3 != SHARED_LIBRARY) && (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) &&
         (TVar3 = GetType(this), TVar3 != EXECUTABLE)) {
        outPrefix_local._4_4_ = RuntimeBinaryArtifact;
      }
      local_a2 = 0;
      local_a3 = 0;
      targetSuffix._6_1_ = 0;
      targetSuffix._5_1_ = 0;
      if ((local_39 & 1) == 0) {
        std::allocator<char>::allocator();
        targetSuffix._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"PREFIX",(allocator<char> *)((long)&targetSuffix + 7));
        targetSuffix._5_1_ = 1;
        local_3c0 = GetProperty(this,&local_c8);
      }
      else {
        std::allocator<char>::allocator();
        local_a2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"IMPORT_PREFIX",&local_a1);
        local_a3 = 1;
        local_3c0 = GetProperty(this,&local_a0);
      }
      if ((targetSuffix._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_c8);
      }
      if ((targetSuffix._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&targetSuffix + 7));
      }
      if ((local_a3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a0);
      }
      if ((local_a2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_a1);
      }
      local_80 = local_3c0;
      local_fa = 0;
      local_fb = 0;
      configPostfix._6_1_ = 0;
      configPostfix._5_1_ = 0;
      if ((local_39 & 1) == 0) {
        std::allocator<char>::allocator();
        configPostfix._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"SUFFIX",(allocator<char> *)((long)&configPostfix + 7));
        configPostfix._5_1_ = 1;
        local_3f0 = GetProperty(this,&local_120);
      }
      else {
        std::allocator<char>::allocator();
        local_fa = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"IMPORT_SUFFIX",&local_f9);
        local_fb = 1;
        local_3f0 = GetProperty(this,&local_f8);
      }
      if ((configPostfix._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_120);
      }
      if ((configPostfix._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&configPostfix + 7));
      }
      if ((local_fb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_f8);
      }
      if ((local_fa & 1) != 0) {
        std::allocator<char>::~allocator(&local_f9);
      }
      local_d8 = local_3f0;
      configProp.field_2._8_8_ = 0;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        cmsys::SystemTools::UpperCase((string *)&prefixVar,psStack_18);
        std::__cxx11::string::operator+=((string *)&prefixVar,"_POSTFIX");
        configProp.field_2._8_8_ = GetProperty(this,(string *)&prefixVar);
        if (((char *)configProp.field_2._8_8_ != (char *)0x0) &&
           ((bVar7 = IsAppBundleOnApple(this), bVar7 || (bVar7 = IsFrameworkOnApple(this), bVar7))))
        {
          configProp.field_2._8_8_ = 0;
        }
        std::__cxx11::string::~string((string *)&prefixVar);
      }
      pcVar5 = cmTarget::GetPrefixVariableInternal(this->Target,outPrefix_local._4_4_);
      __lhs = cmTarget::GetSuffixVariableInternal(this->Target,outPrefix_local._4_4_);
      GetLinkerLanguage((string *)((long)&langSuff.field_2 + 8),this,psStack_18);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        if (((local_d8 == (char *)0x0) && (__lhs != (char *)0x0)) && (*__lhs != '\0')) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e0,"_",
                     (allocator<char> *)(langPrefix.field_2._M_local_buf + 0xf));
          std::operator+(&local_1c0,__lhs,&local_1e0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,&local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&langSuff.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(langPrefix.field_2._M_local_buf + 0xf));
          local_d8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_1a0);
          std::__cxx11::string::~string((string *)local_1a0);
        }
        if (((local_80 == (char *)0x0) && (pcVar5 != (char *)0x0)) && (*pcVar5 != '\0')) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"_",&local_249);
          std::operator+(&local_228,pcVar5,&local_248);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,&local_228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&langSuff.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          local_80 = cmMakefile::GetDefinition(this->Makefile,(string *)local_208);
          std::__cxx11::string::~string((string *)local_208);
        }
      }
      if ((local_80 == (char *)0x0) && (pcVar5 != (char *)0x0)) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar5,&local_271);
        cmMakefile::GetSafeDefinition(pcVar1,&local_270);
        local_80 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator(&local_271);
      }
      if ((local_d8 == (char *)0x0) && (__lhs != (char *)0x0)) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,__lhs,
                   (allocator<char> *)(fw_prefix.field_2._M_local_buf + 0xf));
        cmMakefile::GetSafeDefinition(pcVar1,&local_298);
        local_d8 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator((allocator<char> *)(fw_prefix.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::string(local_2c0);
      bVar7 = IsFrameworkOnApple(this);
      if (bVar7) {
        GetFrameworkDirectory(&local_2e0,this,psStack_18,ContentLevel);
        std::__cxx11::string::operator=(local_2c0,(string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::operator+=(local_2c0,"/");
        local_80 = (char *)std::__cxx11::string::c_str();
        local_d8 = (char *)0x0;
      }
      bVar7 = IsCFBundleOnApple(this);
      if (bVar7) {
        GetCFBundleDirectory(&local_300,this,psStack_18,FullLevel);
        std::__cxx11::string::operator=(local_2c0,(string *)&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::operator+=(local_2c0,"/");
        local_80 = (char *)std::__cxx11::string::c_str();
        local_d8 = (char *)0x0;
      }
      if (local_80 == (char *)0x0) {
        local_4c8 = "";
      }
      else {
        local_4c8 = local_80;
      }
      std::__cxx11::string::operator=((string *)outBase_local,local_4c8);
      GetOutputName((string *)&soversion,this,psStack_18,outPrefix_local._4_4_);
      std::__cxx11::string::operator+=((string *)outSuffix_local,(string *)&soversion);
      std::__cxx11::string::~string((string *)&soversion);
      if (configProp.field_2._8_8_ == 0) {
        local_4d0 = "";
      }
      else {
        local_4d0 = (char *)configProp.field_2._8_8_;
      }
      std::__cxx11::string::operator+=((string *)outSuffix_local,local_4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"SOVERSION",&local_349);
      pcVar5 = GetProperty(this,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
      local_328 = pcVar5;
      if (pcVar5 != (char *)0x0) {
        bVar2 = false;
        bVar7 = false;
        TVar3 = GetType(this);
        local_4e5 = false;
        if ((TVar3 == SHARED_LIBRARY) && (local_4e5 = false, (local_39 & 1) == 0)) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          bVar2 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_370,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION",&local_371);
          bVar7 = true;
          local_4e5 = cmMakefile::IsOn(pcVar1,&local_370);
        }
        if (bVar7) {
          std::__cxx11::string::~string((string *)&local_370);
        }
        if (bVar2) {
          std::allocator<char>::~allocator(&local_371);
        }
        if (local_4e5 != false) {
          std::__cxx11::string::operator+=((string *)outSuffix_local,"-");
          std::__cxx11::string::operator+=((string *)outSuffix_local,local_328);
        }
      }
      if (local_d8 == (char *)0x0) {
        local_508 = "";
      }
      else {
        local_508 = local_d8;
      }
      std::__cxx11::string::operator=((string *)psStack_38,local_508);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string((string *)(langSuff.field_2._M_local_buf + 8));
    }
  }
  else {
    std::__cxx11::string::clear();
    psVar4 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator=((string *)outSuffix_local,(string *)psVar4);
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix.clear();
    outBase = this->GetName();
    outSuffix.clear();
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix.clear();
    outBase.clear();
    outSuffix.clear();
    return;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));
  const char* configPostfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (configPostfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      configPostfix = nullptr;
    }
  }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    if (!targetSuffix && suffixVar && *suffixVar) {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
    }
    if (!targetPrefix && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }
  }

  // if there is no prefix on the target use the cmake definition
  if (!targetPrefix && prefixVar) {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar).c_str();
  }
  // if there is no suffix on the target use the cmake definition
  if (!targetSuffix && suffixVar) {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar).c_str();
  }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix ? configPostfix : "";

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}